

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.c
# Opt level: O2

char * blogc_format_variable
                 (char *name,bc_trie_t *global,bc_trie_t *local,char *foreach_name,
                 bc_slist_t *foreach_var)

{
  _Bool _Var1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  char *name_00;
  char *pcVar6;
  char cVar7;
  ulong uVar8;
  size_t sStack_50;
  size_t local_40;
  char *endptr;
  
  pcVar3 = blogc_get_variable(name,global,local);
  if (pcVar3 != (char *)0x0) {
LAB_0010382c:
    pcVar3 = bc_strdup(pcVar3);
    return pcVar3;
  }
  iVar2 = strcmp(name,"FOREACH_ITEM");
  if (iVar2 == 0) {
    if (foreach_var == (bc_slist_t *)0x0) {
      return (char *)0x0;
    }
    pcVar3 = (char *)foreach_var->data;
    if (pcVar3 == (char *)0x0) {
      return (char *)0x0;
    }
    goto LAB_0010382c;
  }
  iVar2 = strcmp(name,"FOREACH_VALUE");
  if (iVar2 == 0) {
    if (foreach_var == (bc_slist_t *)0x0 || foreach_name == (char *)0x0) {
      return (char *)0x0;
    }
    if ((char *)foreach_var->data == (char *)0x0) {
      return (char *)0x0;
    }
    pcVar6 = foreach_value_variable(foreach_name,(char *)foreach_var->data);
    if (pcVar6 == (char *)0x0) {
      return (char *)0x0;
    }
    pcVar3 = blogc_get_variable(pcVar6,global,local);
    free(pcVar6);
    goto LAB_0010382c;
  }
  pcVar3 = bc_strdup(name);
  sVar4 = strlen(pcVar3);
  sVar5 = sVar4;
  do {
    uVar8 = sVar5;
    if (uVar8 == 1) {
      cVar7 = *pcVar3;
      break;
    }
    cVar7 = pcVar3[uVar8 - 1];
    sVar5 = uVar8 - 1;
  } while ((byte)(cVar7 - 0x30U) < 10);
  if (uVar8 < sVar4 && cVar7 == '_') {
    local_40 = strtol(pcVar3 + uVar8,&endptr,10);
    if (*endptr == '\0') {
      pcVar3[uVar8 - 1] = '\0';
    }
    else {
      fprintf(_stderr,"warning: invalid variable size for \'%s\', ignoring.\n",pcVar3);
      sStack_50 = 0xffffffffffffffff;
      local_40 = sStack_50;
    }
  }
  else {
    local_40 = 0xffffffffffffffff;
  }
  _Var1 = bc_str_ends_with(pcVar3,"_FORMATTED");
  if (_Var1) {
    sVar5 = strlen(pcVar3);
    pcVar3[sVar5 - 10] = '\0';
  }
  iVar2 = strcmp(pcVar3,"FOREACH_ITEM");
  if (((foreach_var == (bc_slist_t *)0x0) || (iVar2 != 0)) ||
     (pcVar6 = (char *)foreach_var->data, pcVar6 == (char *)0x0)) {
    iVar2 = strcmp(pcVar3,"FOREACH_VALUE");
    if (((foreach_var == (bc_slist_t *)0x0) || (foreach_name == (char *)0x0)) ||
       ((iVar2 != 0 || ((char *)foreach_var->data == (char *)0x0)))) {
      blogc_funcvars_eval(global,pcVar3);
      pcVar6 = blogc_get_variable(pcVar3,global,local);
    }
    else {
      name_00 = foreach_value_variable(foreach_name,(char *)foreach_var->data);
      if (name_00 == (char *)0x0) goto LAB_00103a87;
      pcVar6 = blogc_get_variable(name_00,global,local);
      free(name_00);
    }
    if (pcVar6 == (char *)0x0) {
LAB_00103a87:
      free(pcVar3);
      return (char *)0x0;
    }
  }
  if (_Var1) {
    _Var1 = bc_str_starts_with(name,"DATE_");
    if (_Var1) {
      pcVar6 = blogc_format_date(pcVar6,global,local);
      goto LAB_00103a5a;
    }
    fprintf(_stderr,"warning: no formatter found for \'%s\', ignoring.\n",pcVar3);
  }
  pcVar6 = bc_strdup(pcVar6);
LAB_00103a5a:
  free(pcVar3);
  if (0 < (long)local_40) {
    pcVar3 = bc_strndup(pcVar6,local_40);
    free(pcVar6);
    return pcVar3;
  }
  return pcVar6;
}

Assistant:

char*
blogc_format_variable(const char *name, bc_trie_t *global, bc_trie_t *local,
    const char *foreach_name, bc_slist_t *foreach_var)
{
    // if used asked for a variable that exists, just return it right away
    const char *value = blogc_get_variable(name, global, local);
    if (value != NULL)
        return bc_strdup(value);

    // do the same for special foreach variables
    if (0 == strcmp(name, "FOREACH_ITEM")) {
        if (foreach_var != NULL && foreach_var->data != NULL) {
            return bc_strdup(foreach_var->data);
        }
        return NULL;
    }
    if (0 == strcmp(name, "FOREACH_VALUE")) {
        if (foreach_name != NULL && foreach_var != NULL && foreach_var->data != NULL) {
            char *value_var = foreach_value_variable(foreach_name, foreach_var->data);
            if (value_var != NULL) {
                value = blogc_get_variable(value_var, global, local);
                free(value_var);
                return bc_strdup(value);
            }
        }
        return NULL;
    }

    char *var = bc_strdup(name);

    size_t i;
    size_t last = strlen(var);

    long int len = -1;

    // just walk till the last '_'
    for (i = last - 1; i > 0 && var[i] >= '0' && var[i] <= '9'; i--);

    if (var[i] == '_' && (i + 1) < last) {  // var ends with '_[0-9]+'
        char *endptr;
        len = strtol(var + i + 1, &endptr, 10);
        if (*endptr != '\0') {
            fprintf(stderr, "warning: invalid variable size for '%s', "
                "ignoring.\n", var);
            len = -1;
        }
        else {
            var[i] = '\0';
        }
    }

    bool must_format = false;

    if (bc_str_ends_with(var, "_FORMATTED")) {
        var[strlen(var) - 10] = '\0';
        must_format = true;
    }

    if ((0 == strcmp(var, "FOREACH_ITEM")) &&
        (foreach_var != NULL && foreach_var->data != NULL)) {
        value = foreach_var->data;
    }
    else if ((0 == strcmp(var, "FOREACH_VALUE")) &&
        (foreach_name != NULL && foreach_var != NULL && foreach_var->data != NULL)) {
        char *value_var = foreach_value_variable(foreach_name, foreach_var->data);
        if (value_var != NULL) {
            value = blogc_get_variable(value_var, global, local);
            free(value_var);
        }
    }
    else {
        blogc_funcvars_eval(global, var);
        value = blogc_get_variable(var, global, local);
    }

    if (value == NULL) {
        free(var);
        return NULL;
    }

    char *rv = NULL;

    if (must_format) {
        if (bc_str_starts_with(name, "DATE_")) {
            rv = blogc_format_date(value, global, local);
        }
        else {
            fprintf(stderr, "warning: no formatter found for '%s', "
                "ignoring.\n", var);
            rv = bc_strdup(value);
        }
    }
    else {
        rv = bc_strdup(value);
    }

    free(var);

    if (len > 0) {
        char *tmp = bc_strndup(rv, len);
        free(rv);
        rv = tmp;
    }

    return rv;
}